

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> * __thiscall
slang::SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::operator=
          (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *this,
          SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *rhs)

{
  pointer pEVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pEVar5;
  long lVar6;
  
  if (this != rhs) {
    pEVar1 = rhs->data_;
    if (pEVar1 == (pointer)rhs->firstElement) {
      uVar3 = this->len;
      uVar4 = rhs->len;
      if (uVar3 < uVar4) {
        if (this->cap < uVar4) {
          this->len = 0;
          reserve(this,rhs->len);
        }
        else if (uVar3 != 0) {
          memmove(this->data_,pEVar1,uVar3 << 3);
        }
        sVar2 = rhs->len;
        if (this->len != sVar2) {
          pEVar1 = rhs->data_;
          pEVar5 = this->data_;
          lVar6 = this->len << 3;
          do {
            *(undefined8 *)((long)&pEVar5->value + lVar6) =
                 *(undefined8 *)((long)&pEVar1->value + lVar6);
            lVar6 = lVar6 + 8;
          } while (sVar2 << 3 != lVar6);
        }
      }
      else if (uVar4 != 0) {
        memmove(this->data_,pEVar1,uVar4 << 3);
      }
      this->len = rhs->len;
      rhs->len = 0;
    }
    else {
      if (this->data_ != (pointer)this->firstElement) {
        operator_delete(this->data_);
      }
      pEVar1 = rhs->data_;
      rhs->data_ = (pointer)0x0;
      this->data_ = pEVar1;
      sVar2 = rhs->len;
      rhs->len = 0;
      this->len = sVar2;
      sVar2 = rhs->cap;
      rhs->cap = 0;
      this->cap = sVar2;
    }
  }
  return this;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(SmallVectorBase<T>&& rhs) {
    if (this == &rhs)
        return *this;

    // If the rhs isn't small, clear this vector and then steal its buffer.
    if (!rhs.isSmall()) {
        cleanup();
        this->data_ = std::exchange(rhs.data_, nullptr);
        this->len = std::exchange(rhs.len, 0);
        this->cap = std::exchange(rhs.cap, 0);
        return *this;
    }

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::move(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        rhs.clear();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::move(rhs.begin(), rhs.begin() + len, begin());
    }

    // Move construct the new elements in place.
    std::uninitialized_move(rhs.begin() + len, rhs.end(), begin() + len);
    len = rhs.size();
    rhs.clear();
    return *this;
}